

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshVertexColors(CXMeshFileLoader *this,SXMesh *mesh)

{
  bool bVar1;
  u32 uVar2;
  u32 index;
  u32 uVar3;
  long in_RSI;
  array<irr::video::S3DVertex> *in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  u32 Index;
  u32 i;
  u32 nColors;
  CXMeshFileLoader *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  CXMeshFileLoader *in_stack_ffffffffffffff70;
  CXMeshFileLoader *in_stack_ffffffffffffff78;
  stringc *in_stack_ffffffffffffffa0;
  CXMeshFileLoader *in_stack_ffffffffffffffa8;
  uint local_40;
  bool local_1;
  
  bVar1 = readHeadOfDataObject(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (bVar1) {
    *(undefined1 *)(in_RSI + 0x155) = 1;
    uVar2 = readInt(in_stack_ffffffffffffff58);
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      index = readInt(in_stack_ffffffffffffff58);
      uVar3 = core::array<irr::video::S3DVertex>::size((array<irr::video::S3DVertex> *)0x2e70d5);
      if (uVar3 <= index) {
        os::Printer::log((Printer *)"index value in parseDataObjectMeshVertexColors out of bounds",
                         __x_01);
        core::string<char>::string
                  ((string<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        core::string<char>::c_str((string<char> *)0x2e710c);
        os::Printer::log(__x_02);
        core::string<char>::~string((string<char> *)0x2e712a);
        *(undefined1 *)
         &in_RDI[2].m_data.
          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 1;
        return false;
      }
      core::array<irr::video::S3DVertex>::operator[](in_RDI,index);
      readRGBA(in_stack_ffffffffffffff70,
               (SColor *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      checkForOneFollowingSemicolons(in_stack_ffffffffffffff78);
    }
    bVar1 = checkForOneFollowingSemicolons(in_stack_ffffffffffffff78);
    if (!bVar1) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Vertex Colors Array found in x file",__x_03);
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      core::string<char>::c_str((string<char> *)0x2e71bb);
      os::Printer::log(__x_04);
      core::string<char>::~string((string<char> *)0x2e71d9);
    }
    bVar1 = checkForClosingBrace(in_stack_ffffffffffffff70);
    if (bVar1) {
      local_1 = true;
    }
    else {
      os::Printer::log((Printer *)
                       "No closing brace in Mesh Texture Coordinates Array found in x file",__x_05);
      core::string<char>::string
                ((string<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      core::string<char>::c_str((string<char> *)0x2e7214);
      os::Printer::log(__x_06);
      core::string<char>::~string((string<char> *)0x2e7232);
      local_1 = false;
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace for Mesh Vertex Colors found in x file",__x);
    core::string<char>::string((string<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    core::string<char>::c_str((string<char> *)0x2e7044);
    os::Printer::log(__x_00);
    core::string<char>::~string((string<char> *)0x2e7065);
    *(undefined1 *)
     &in_RDI[2].m_data.
      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshVertexColors(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh vertex colors", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace for Mesh Vertex Colors found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	mesh.HasVertexColors = true;
	const u32 nColors = readInt();
	for (u32 i = 0; i < nColors; ++i) {
		const u32 Index = readInt();
		if (Index >= mesh.Vertices.size()) {
			os::Printer::log("index value in parseDataObjectMeshVertexColors out of bounds", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
		readRGBA(mesh.Vertices[Index].Color);
		checkForOneFollowingSemicolons();
	}

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Colors Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Texture Coordinates Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		return false;
	}

	return true;
}